

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

int get_line_infos(char *buf,size_t buf_len,LineInfo **line_infos,size_t *num_lines)

{
  int iVar1;
  LineInfo *pLVar2;
  long *in_FS_OFFSET;
  size_t local_58;
  size_t last_line_ending;
  size_t line_no;
  size_t prev_pos;
  size_t end_idx;
  size_t i;
  size_t *num_lines_local;
  LineInfo **line_infos_local;
  size_t buf_len_local;
  char *buf_local;
  
  line_no = 0;
  last_line_ending = 0;
  local_58 = 0;
  for (end_idx = 0; end_idx < buf_len; end_idx = end_idx + 1) {
    iVar1 = is_line_ending(buf,end_idx,buf_len);
    if (iVar1 != 0) {
      *num_lines = *num_lines + 1;
      local_58 = end_idx;
    }
  }
  if (buf_len != local_58) {
    *num_lines = *num_lines + 1;
  }
  if (*num_lines == 0) {
    buf_local._4_4_ = -1;
  }
  else {
    pLVar2 = (LineInfo *)(**(code **)(*in_FS_OFFSET + -0x438))(*in_FS_OFFSET + -0x440,1);
    *line_infos = pLVar2;
    for (end_idx = 0; end_idx < buf_len; end_idx = end_idx + 1) {
      iVar1 = is_line_ending(buf,end_idx,buf_len);
      if (iVar1 != 0) {
        (*line_infos)[last_line_ending].pos = line_no;
        (*line_infos)[last_line_ending].len = end_idx - line_no;
        line_no = end_idx + 1;
        last_line_ending = last_line_ending + 1;
      }
    }
    if (buf_len != local_58) {
      (*line_infos)[last_line_ending].pos = line_no;
      (*line_infos)[last_line_ending].len = (buf_len - 1) - local_58;
    }
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

static int get_line_infos(const char *buf, size_t buf_len, LineInfo **line_infos, size_t *num_lines)
{
  size_t i = 0;
  size_t end_idx = buf_len;
  size_t prev_pos = 0;
  size_t line_no = 0;
  size_t last_line_ending = 0;

  /* Count # of lines. */
  for (i = 0; i < end_idx; i++) {
    if (is_line_ending(buf, i, end_idx)) {
      (*num_lines)++;
      last_line_ending = i;
    }
  }
  /* The last char from the input may not be a line
    * ending character so add an extra line if there
    * are more characters after the last line ending
    * that was found. */
  if (end_idx - last_line_ending > 0) {
      (*num_lines)++;
  }

  if (*num_lines == 0) return TINYOBJ_ERROR_EMPTY;

  *line_infos = (LineInfo *)TINYOBJ_MALLOC(sizeof(LineInfo) * (*num_lines));

  /* Fill line infos. */
  for (i = 0; i < end_idx; i++) {
    if (is_line_ending(buf, i, end_idx)) {
      (*line_infos)[line_no].pos = prev_pos;
      (*line_infos)[line_no].len = i - prev_pos;
      prev_pos = i + 1;
      line_no++;
    }
  }
  if (end_idx - last_line_ending > 0) {
    (*line_infos)[line_no].pos = prev_pos;
    (*line_infos)[line_no].len = end_idx - 1 - last_line_ending;
  }

  return 0;
}